

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSimpleProperty::~IfcSimpleProperty(IfcSimpleProperty *this)

{
  ~IfcSimpleProperty((IfcSimpleProperty *)&this[-1].super_IfcProperty.field_0x28);
  return;
}

Assistant:

IfcSimpleProperty() : Object("IfcSimpleProperty") {}